

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvidiamon.cpp
# Opt level: O0

void __thiscall
nvidiamon::update_stats(nvidiamon *this,vector<int,_std::allocator<int>_> *pids,string *read_path)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  ostream *poVar5;
  size_type sVar6;
  char *pcVar7;
  istream *piVar8;
  reference piVar9;
  ulong uVar10;
  mapped_type *pmVar11;
  size_type sVar12;
  mapped_type *pmVar13;
  void *this_00;
  MessageBase *this_01;
  string *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>
  *value_2;
  iterator __end2_1;
  iterator __begin2_1;
  monitored_list *__range2_1;
  stringstream strm_3;
  stringstream strm_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>
  *value_1;
  iterator __end3_1;
  iterator __begin3_1;
  monitored_list *__range3_1;
  int p;
  const_iterator __end3;
  const_iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  stringstream strm_1;
  bool read_ok;
  istringstream instr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  activegpus;
  string cmd_name;
  string ccpm;
  string cg_type;
  string ofa;
  string jpg;
  string dec;
  string enc;
  pid_t pid;
  uint fb_mem;
  uint mem;
  uint sm;
  uint gpu_idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int i;
  stringstream strm;
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cmd_result;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>
  *value;
  iterator __end1;
  iterator __begin1;
  monitored_list *__range1;
  monitored_value_map nvidia_stats_update;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string *in_stack_ffffffffffffeef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffef10;
  allocator_type *in_stack_ffffffffffffef28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffef30;
  undefined7 in_stack_ffffffffffffef38;
  byte in_stack_ffffffffffffef3f;
  ostream *in_stack_ffffffffffffef40;
  undefined4 in_stack_ffffffffffffef48;
  int in_stack_ffffffffffffef4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffef50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff038;
  ostream *in_stack_fffffffffffff110;
  monitored_value *in_stack_fffffffffffff118;
  string *in_stack_fffffffffffff180;
  undefined5 in_stack_fffffffffffff188;
  undefined1 in_stack_fffffffffffff18d;
  undefined1 in_stack_fffffffffffff18e;
  byte bVar14;
  undefined1 in_stack_fffffffffffff18f;
  string *local_d98;
  string local_d18 [32];
  reference local_cf8;
  _Self local_cf0;
  _Self local_ce8;
  long local_ce0;
  stringstream local_cd8 [16];
  ostream local_cc8 [376];
  string local_b50 [32];
  stringstream local_b30 [16];
  ostream local_b20 [376];
  reference local_9a8;
  _Self local_9a0;
  _Self local_998;
  long local_990;
  allocator local_981;
  string local_980 [39];
  allocator local_959;
  string local_958 [39];
  allocator local_931;
  string local_930 [39];
  allocator local_909;
  string local_908 [36];
  int local_8e4;
  int *local_8e0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_8d8;
  undefined8 local_8d0;
  string local_8c8 [32];
  stringstream local_8a8 [16];
  ostream local_898 [383];
  byte local_719;
  istringstream local_718 [384];
  reference local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_590;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_588;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_580;
  undefined1 local_578 [56];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [36];
  int local_45c;
  uint local_458;
  uint local_454;
  uint local_450;
  uint local_44c;
  string local_448 [32];
  reference local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_410;
  int local_404;
  stringstream local_400 [16];
  ostream local_3f0 [380];
  undefined4 local_274;
  string local_270 [32];
  string local_250 [32];
  string local_230 [88];
  string local_1d8 [64];
  int local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  reference local_178;
  _Self local_170;
  _Self local_168;
  long local_160;
  undefined1 local_158 [54];
  undefined1 local_122;
  allocator local_121;
  allocator local_120;
  allocator local_11f;
  allocator local_11e;
  allocator local_11d [20];
  allocator local_109;
  string *local_108;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string *local_40;
  undefined8 local_38;
  undefined8 local_10;
  
  local_122 = 1;
  local_108 = local_100;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"nvidia-smi",&local_109);
  local_108 = local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"pmon",local_11d);
  local_108 = local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"-s",&local_11e);
  local_108 = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"um",&local_11f);
  local_108 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"-c",&local_120);
  local_108 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"1",&local_121);
  local_122 = 0;
  local_40 = local_100;
  local_38 = 6;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x35e64a);
  __l._M_array._7_1_ = in_stack_ffffffffffffef3f;
  __l._M_array._0_7_ = in_stack_ffffffffffffef38;
  __l._M_len = (size_type)in_stack_ffffffffffffef40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffef30,__l,in_stack_ffffffffffffef28);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x35e67e);
  local_d98 = (string *)&local_40;
  do {
    local_d98 = local_d98 + -0x20;
    std::__cxx11::string::~string(local_d98);
  } while (local_d98 != local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e);
  std::allocator<char>::~allocator((allocator<char> *)local_11d);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  memset(local_158,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
         *)0x35e741);
  local_160 = in_RDI + 0x38;
  local_168._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                *)in_stack_ffffffffffffeef8);
  local_170._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
              *)in_stack_ffffffffffffeef8);
  while (bVar1 = std::operator!=(&local_168,&local_170), bVar1) {
    local_178 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                             *)0x35e7aa);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                            *)in_stack_ffffffffffffef40,
                           (key_type *)CONCAT17(in_stack_ffffffffffffef3f,in_stack_ffffffffffffef38)
                          );
    *pmVar11 = 0;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                  *)in_stack_ffffffffffffef00);
  }
  std::
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
            ((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffef00);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_ffffffffffffef50,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48));
    prmon::cmd_pipe_output(in_stack_fffffffffffff038);
    std::
    pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffef00,(type)in_stack_ffffffffffffeef8);
    std::
    pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x35eae7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_ffffffffffffef10);
    if (local_198 != 0) {
      std::__cxx11::to_string(in_stack_ffffffffffffef4c);
      std::operator+((char *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00);
      std::operator+(in_stack_ffffffffffffef08,(char *)in_stack_ffffffffffffef00);
      MessageBase::error((MessageBase *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::string::~string(local_270);
      local_274 = 1;
      goto LAB_003602fb;
    }
  }
  else {
    std::__cxx11::string::string(local_1d8,in_RDX);
    read_gpu_stats_test((nvidiamon *)
                        CONCAT17(in_stack_fffffffffffff18f,
                                 CONCAT16(in_stack_fffffffffffff18e,
                                          CONCAT15(in_stack_fffffffffffff18d,
                                                   in_stack_fffffffffffff188))),
                        in_stack_fffffffffffff180);
    std::
    pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffef00,(type)in_stack_ffffffffffffeef8);
    std::
    pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x35ea44);
    std::__cxx11::string::~string(local_1d8);
  }
  if (*(int *)(in_RDI + 0x18) < 2) {
    std::__cxx11::stringstream::stringstream(local_400);
    poVar5 = std::operator<<(local_3f0,"nvidiamon::update_stats got the following output (");
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_190);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    poVar5 = std::operator<<(poVar5,"): ");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_404 = 0;
    local_410 = &local_190;
    local_418._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffeef8);
    local_420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffeef8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffef00,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffeef8), bVar1) {
      local_428 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_418);
      poVar5 = (ostream *)std::ostream::operator<<(local_3f0,local_404);
      poVar5 = std::operator<<(poVar5," -> ");
      poVar5 = std::operator<<(poVar5,(string *)local_428);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_404 = local_404 + 1;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_418);
    }
    std::__cxx11::stringstream::str();
    MessageBase::debug((MessageBase *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::stringstream::~stringstream(local_400);
  }
  local_44c = 0;
  local_450 = 0;
  local_454 = 0;
  local_458 = 0;
  local_45c = 0;
  std::__cxx11::string::string(local_480);
  std::__cxx11::string::string(local_4a0);
  std::__cxx11::string::string(local_4c0);
  std::__cxx11::string::string(local_4e0);
  std::__cxx11::string::string(local_500);
  std::__cxx11::string::string(local_520);
  std::__cxx11::string::string(local_540);
  memset(local_578,0,0x38);
  std::
  unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  ::unordered_map((unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                   *)0x35ef71);
  local_580 = &local_190;
  local_588._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffeef8);
  local_590 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffeef8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffef00,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffeef8), bVar1) {
    local_598 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_588);
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_598);
    if (*pcVar7 != '#') {
      std::__cxx11::istringstream::istringstream(local_718,(string *)local_598,_S_in);
      piVar8 = (istream *)std::istream::operator>>((istream *)local_718,&local_44c);
      piVar8 = (istream *)std::istream::operator>>(piVar8,&local_45c);
      piVar8 = std::operator>>(piVar8,local_500);
      piVar8 = (istream *)std::istream::operator>>(piVar8,&local_450);
      piVar8 = (istream *)std::istream::operator>>(piVar8,&local_454);
      piVar8 = std::operator>>(piVar8,local_480);
      piVar8 = std::operator>>(piVar8,local_4a0);
      piVar8 = std::operator>>(piVar8,local_4c0);
      piVar8 = std::operator>>(piVar8,local_4e0);
      piVar8 = (istream *)std::istream::operator>>(piVar8,&local_458);
      piVar8 = std::operator>>(piVar8,local_520);
      std::operator>>(piVar8,local_540);
      bVar2 = std::ios::fail();
      bVar14 = 1;
      if ((bVar2 & 1) == 0) {
        bVar14 = std::ios::bad();
      }
      local_719 = (bVar14 ^ 0xff) & 1;
      if (local_719 == 0) {
        if (*(int *)(in_RDI + 0x18) < 2) {
          std::__cxx11::stringstream::stringstream(local_b30);
          poVar5 = std::operator<<(local_b20,"Bad read of line: ");
          poVar5 = std::operator<<(poVar5,(string *)local_598);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(local_b20,"Parsed to: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_44c);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_45c);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_500);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_450);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_454);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_480);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_4a0);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_4c0);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_4e0);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_458);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_520);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_540);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(local_b20,"StringStream status: good()=");
          bVar2 = std::ios::good();
          std::ostream::operator<<(poVar5,(bool)(bVar2 & 1));
          poVar5 = std::operator<<(local_b20," eof()=");
          bVar2 = std::ios::eof();
          std::ostream::operator<<(poVar5,(bool)(bVar2 & 1));
          poVar5 = std::operator<<(local_b20," fail()=");
          bVar2 = std::ios::fail();
          std::ostream::operator<<(poVar5,(bool)(bVar2 & 1));
          in_stack_ffffffffffffef40 = std::operator<<(local_b20," bad()=");
          in_stack_ffffffffffffef3f = std::ios::bad();
          this_00 = (void *)std::ostream::operator<<
                                      (in_stack_ffffffffffffef40,
                                       (bool)(in_stack_ffffffffffffef3f & 1));
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          std::__cxx11::stringstream::str();
          MessageBase::debug((MessageBase *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
          std::__cxx11::string::~string(local_b50);
          std::__cxx11::stringstream::~stringstream(local_b30);
        }
      }
      else {
        if (*(int *)(in_RDI + 0x18) < 2) {
          std::__cxx11::stringstream::stringstream(local_8a8);
          poVar5 = std::operator<<(local_898,"Good read: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_44c);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_45c);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_500);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_450);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_454);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_480);
          poVar5 = std::operator<<(poVar5," ");
          in_stack_fffffffffffff118 = (monitored_value *)std::operator<<(poVar5,local_4a0);
          in_stack_fffffffffffff110 = std::operator<<((ostream *)in_stack_fffffffffffff118," ");
          poVar5 = std::operator<<(in_stack_fffffffffffff110,local_4c0);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_4e0);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_458);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_520);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,local_540);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::stringstream::str();
          MessageBase::debug((MessageBase *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
          std::__cxx11::string::~string(local_8c8);
          std::__cxx11::stringstream::~stringstream(local_8a8);
        }
        local_8d0 = local_10;
        local_8d8._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeef8);
        local_8e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeef8
                                     );
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffef00,
                                  (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffeef8), bVar1) {
          piVar9 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_8d8);
          local_8e4 = *piVar9;
          if (local_8e4 == local_45c) {
            uVar10 = (ulong)local_450;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_908,"gpusmpct",&local_909);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                    *)in_stack_ffffffffffffef40,
                                   (key_type *)
                                   CONCAT17(in_stack_ffffffffffffef3f,in_stack_ffffffffffffef38));
            *pmVar11 = *pmVar11 + uVar10;
            std::__cxx11::string::~string(local_908);
            std::allocator<char>::~allocator((allocator<char> *)&local_909);
            uVar10 = (ulong)local_454;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_930,"gpumempct",&local_931);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                    *)in_stack_ffffffffffffef40,
                                   (key_type *)
                                   CONCAT17(in_stack_ffffffffffffef3f,in_stack_ffffffffffffef38));
            *pmVar11 = *pmVar11 + uVar10;
            std::__cxx11::string::~string(local_930);
            std::allocator<char>::~allocator((allocator<char> *)&local_931);
            uVar3 = local_458 * *(int *)(in_RDI + 0x70);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_958,"gpufbmem",&local_959);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                    *)in_stack_ffffffffffffef40,
                                   (key_type *)
                                   CONCAT17(in_stack_ffffffffffffef3f,in_stack_ffffffffffffef38));
            *pmVar11 = *pmVar11 + (ulong)uVar3;
            std::__cxx11::string::~string(local_958);
            std::allocator<char>::~allocator((allocator<char> *)&local_959);
            sVar12 = std::
                     unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                     ::count((unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                              *)in_stack_ffffffffffffef00,(key_type *)in_stack_ffffffffffffeef8);
            if (sVar12 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_980,"ngpus",&local_981);
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                      *)in_stack_ffffffffffffef40,
                                     (key_type *)
                                     CONCAT17(in_stack_ffffffffffffef3f,in_stack_ffffffffffffef38));
              *pmVar11 = *pmVar11 + 1;
              std::__cxx11::string::~string(local_980);
              std::allocator<char>::~allocator((allocator<char> *)&local_981);
              pmVar13 = std::
                        unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                        ::operator[]((unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                                      *)in_stack_ffffffffffffef00,
                                     (key_type *)in_stack_ffffffffffffeef8);
              *pmVar13 = true;
            }
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&local_8d8);
        }
        local_990 = in_RDI + 0x38;
        local_998._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                      *)in_stack_ffffffffffffeef8);
        local_9a0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                    *)in_stack_ffffffffffffeef8);
        while (bVar1 = std::operator!=(&local_998,&local_9a0), bVar1) {
          local_9a8 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                      ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                                   *)0x35fac3);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                        *)in_stack_ffffffffffffef40,
                       (key_type *)CONCAT17(in_stack_ffffffffffffef3f,in_stack_ffffffffffffef38));
          prmon::monitored_value::set_value
                    (in_stack_fffffffffffff118,(mon_value)in_stack_fffffffffffff110);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                        *)in_stack_ffffffffffffef00);
        }
      }
      std::__cxx11::istringstream::~istringstream(local_718);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_588);
  }
  if (*(int *)(in_RDI + 0x18) < 2) {
    std::__cxx11::stringstream::stringstream(local_cd8);
    std::operator<<(local_cc8,"Parsed: ");
    local_ce0 = in_RDI + 0x38;
    local_ce8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                  *)in_stack_ffffffffffffeef8);
    local_cf0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                *)in_stack_ffffffffffffeef8);
    while (bVar1 = std::operator!=(&local_ce8,&local_cf0), bVar1) {
      local_cf8 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                               *)0x360156);
      poVar5 = std::operator<<(local_cc8,(string *)local_cf8);
      poVar5 = std::operator<<(poVar5,": ");
      in_stack_ffffffffffffef10 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)prmon::monitored_value::get_value(&local_cf8->second);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulonglong)in_stack_ffffffffffffef10);
      std::operator<<(poVar5,";");
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>
                    *)in_stack_ffffffffffffef00);
    }
    this_01 = (MessageBase *)(in_RDI + 8);
    std::__cxx11::stringstream::str();
    MessageBase::debug(this_01,in_stack_ffffffffffffeef8);
    std::__cxx11::string::~string(local_d18);
    std::__cxx11::stringstream::~stringstream(local_cd8);
  }
  std::
  unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                    *)0x360295);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::~string(local_4c0);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_480);
  local_274 = 0;
LAB_003602fb:
  std::
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~pair((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x360308);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
          *)0x360315);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffef10);
  return;
}

Assistant:

void nvidiamon::update_stats(const std::vector<pid_t>& pids,
                             const std::string read_path) {
  const std::vector<std::string> cmd = {"nvidia-smi", "pmon", "-s",
                                        "um",         "-c",   "1"};
  prmon::monitored_value_map nvidia_stats_update{};
  for (const auto& value : nvidia_stats) nvidia_stats_update[value.first] = 0L;

  std::pair<int, std::vector<std::string>> cmd_result;
  if (read_path.size()) {
    cmd_result = read_gpu_stats_test(read_path);
  } else {
    cmd_result = prmon::cmd_pipe_output(cmd);
    if (cmd_result.first) {
      // Failed
      error("Failed to execute 'nvidia-smi' to get GPU status (code " +
            std::to_string(cmd_result.first) + ")");
      return;
    }
  }
  if (log_level <= spdlog::level::debug) {
    std::stringstream strm;
    strm << "nvidiamon::update_stats got the following output ("
         << cmd_result.second.size() << "): " << std::endl;
    int i = 0;
    for (const auto& s : cmd_result.second) {
      strm << i << " -> " << s << std::endl;
      ++i;
    }
    debug(strm.str());
  }

  // Loop over output
  unsigned int gpu_idx{}, sm{}, mem{}, fb_mem{};
  pid_t pid{};
  std::string enc{}, dec{}, jpg{}, ofa{}, cg_type{}, ccpm{}, cmd_name{};
  std::unordered_map<unsigned int, bool>
      activegpus{};  // Avoid double counting active GPUs
  for (const auto& s : cmd_result.second) {
    if (s[0] == '#') continue;
    std::istringstream instr(s);
    instr >> gpu_idx >> pid >> cg_type >> sm >> mem >> enc >> dec >> jpg >> ofa >> fb_mem >>
          ccpm  >> cmd_name;
    auto read_ok = !(instr.fail() || instr.bad());  // eof() is ok
    if (read_ok) {
      if (log_level <= spdlog::level::debug) {
        std::stringstream strm;
        strm << "Good read: " << gpu_idx << " " << pid << " " << cg_type << " "
             << sm << " " << mem << " " << enc << " " << dec << " " << jpg << " " << ofa << " " << fb_mem << " " << ccpm
             << " " << cmd_name << std::endl;
        debug(strm.str());
      }

      // Filter on PID value, so we only add stats for our processes
      for (auto const p : pids) {
        if (p == pid) {
          nvidia_stats_update["gpusmpct"] += sm;
          nvidia_stats_update["gpumempct"] += mem;
          nvidia_stats_update["gpufbmem"] += fb_mem * MB_to_KB;
          if (!activegpus.count(gpu_idx)) {
            ++nvidia_stats_update["ngpus"];
            activegpus[gpu_idx] = true;
          }
        }
      }

      // Now move summed stats to the persistent counters
      for (auto& value : nvidia_stats) {
        value.second.set_value(nvidia_stats_update[value.first]);
      }
    } else if (log_level <= spdlog::level::debug) {
      std::stringstream strm;
      strm << "Bad read of line: " << s << std::endl;
      strm << "Parsed to: " << gpu_idx << " " << pid << " " << cg_type << " "
           << sm << " " << mem << " " << enc << " " << dec << " " << jpg << " " << ofa << " " << fb_mem << " " << ccpm
           << " " << cmd_name << std::endl;

      strm << "StringStream status: good()=" << instr.good();
      strm << " eof()=" << instr.eof();
      strm << " fail()=" << instr.fail();
      strm << " bad()=" << instr.bad() << std::endl;
      debug(strm.str());
    }
  }

  if (log_level <= spdlog::level::debug) {
    std::stringstream strm;
    strm << "Parsed: ";
    for (const auto& value : nvidia_stats) {
      strm << value.first << ": " << value.second.get_value() << ";";
    }
    debug(strm.str());
  }
}